

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O3

void secp256k1_fe_impl_inv_var(secp256k1_fe *r,secp256k1_fe *x)

{
  secp256k1_fe tmp;
  secp256k1_modinv64_signed62 s;
  secp256k1_fe local_78;
  secp256k1_modinv64_signed62 local_48;
  
  local_78.n[4] = x->n[4];
  local_78.n[0] = x->n[0];
  local_78.n[1] = x->n[1];
  local_78.n[2] = x->n[2];
  local_78.n[3] = x->n[3];
  secp256k1_fe_impl_normalize_var(&local_78);
  local_48.v[0] = (local_78.n[1] << 0x34 | local_78.n[0]) & 0x3fffffffffffffff;
  local_48.v[1] = (ulong)((uint)local_78.n[2] & 0xfffff) << 0x2a | local_78.n[1] >> 10;
  local_48.v[2] = (local_78.n[3] & 0x3fffffff) << 0x20 | local_78.n[2] >> 0x14;
  local_48.v[3] = (local_78.n[4] & 0xffffffffff) << 0x16 | local_78.n[3] >> 0x1e;
  local_48.v[4] = local_78.n[4] >> 0x28;
  secp256k1_modinv64_var(&local_48,&secp256k1_const_modinfo_fe);
  r->n[0] = local_48.v[0] & 0xfffffffffffff;
  r->n[1] = (local_48.v[1] & 0x3ffffffffffU) << 10 | (ulong)local_48.v[0] >> 0x34;
  r->n[2] = (local_48.v[2] & 0xffffffffU) << 0x14 | (ulong)local_48.v[1] >> 0x2a;
  r->n[3] = (local_48.v[3] & 0x3fffffU) << 0x1e | (ulong)local_48.v[2] >> 0x20;
  r->n[4] = local_48.v[4] << 0x28 | (ulong)local_48.v[3] >> 0x16;
  return;
}

Assistant:

static void secp256k1_fe_impl_inv_var(secp256k1_fe *r, const secp256k1_fe *x) {
    secp256k1_fe tmp = *x;
    secp256k1_modinv64_signed62 s;

    secp256k1_fe_normalize_var(&tmp);
    secp256k1_fe_to_signed62(&s, &tmp);
    secp256k1_modinv64_var(&s, &secp256k1_const_modinfo_fe);
    secp256k1_fe_from_signed62(r, &s);
}